

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

ssize_t hd_inflate_read_len(nghttp2_hd_inflater *inflater,int *rfin,uint8_t *in,uint8_t *last,
                           size_t prefix,size_t maxlen)

{
  uint local_4c [2];
  uint32_t out;
  ssize_t rv;
  size_t maxlen_local;
  size_t prefix_local;
  uint8_t *last_local;
  uint8_t *in_local;
  int *rfin_local;
  nghttp2_hd_inflater *inflater_local;
  
  *rfin = 0;
  rv = maxlen;
  maxlen_local = prefix;
  prefix_local = (size_t)last;
  last_local = in;
  in_local = (uint8_t *)rfin;
  rfin_local = (int *)inflater;
  inflater_local =
       (nghttp2_hd_inflater *)
       decode_length(local_4c,&inflater->shift,rfin,(uint32_t)inflater->left,inflater->shift,in,last
                     ,prefix);
  if (inflater_local == (nghttp2_hd_inflater *)0xffffffffffffffff) {
    inflater_local = (nghttp2_hd_inflater *)0xfffffffffffffdf5;
  }
  else if ((ulong)rv < (ulong)local_4c[0]) {
    inflater_local = (nghttp2_hd_inflater *)0xfffffffffffffdf5;
  }
  else {
    *(ulong *)(rfin_local + 0x2e) = (ulong)local_4c[0];
  }
  return (ssize_t)inflater_local;
}

Assistant:

static ssize_t hd_inflate_read_len(nghttp2_hd_inflater *inflater, int *rfin,
                                   const uint8_t *in, const uint8_t *last,
                                   size_t prefix, size_t maxlen) {
  ssize_t rv;
  uint32_t out;

  *rfin = 0;

  rv = decode_length(&out, &inflater->shift, rfin, (uint32_t)inflater->left,
                     inflater->shift, in, last, prefix);

  if (rv == -1) {
    DEBUGF("inflatehd: integer decoding failed\n");
    return NGHTTP2_ERR_HEADER_COMP;
  }

  if (out > maxlen) {
    DEBUGF("inflatehd: integer exceeded the maximum value %zu\n", maxlen);
    return NGHTTP2_ERR_HEADER_COMP;
  }

  inflater->left = out;

  DEBUGF("inflatehd: decoded integer is %u\n", out);

  return rv;
}